

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureFilteringTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Accuracy::TextureFilteringTests::init(TextureFilteringTests *this,EVP_PKEY_CTX *ctx)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  TestContext *pTVar4;
  deBool dVar5;
  TestNode *node;
  TestNode *node_00;
  ulong extraout_RAX;
  Texture2DFilteringCase *this_00;
  RenderContext *pRVar6;
  ContextInfo *pCVar7;
  char *pcVar8;
  ulong uVar9;
  TextureCubeFilteringCase *this_01;
  bool bVar10;
  bool local_38a;
  bool local_389;
  bool local_342;
  allocator<char> local_321;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  string name_1;
  int iStack_1d0;
  bool isPotSize_1;
  bool isMagNearest_1;
  bool isRepeat_1;
  bool isClamp_1;
  bool isMipmap_1;
  int size_1;
  int format_1;
  int wrapMode_1;
  int magFilter_1;
  int minFilter_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  allocator<char> local_171;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_90 [8];
  string name;
  int iStack_64;
  bool isPotSize;
  bool isMagNearest;
  bool isRepeat;
  bool isClamp;
  bool isMipmap;
  int size;
  int format;
  int wrapMode;
  int magFilter;
  int minFilter;
  TestCaseGroup *groupCube;
  TestCaseGroup *group2D;
  TextureFilteringTests *this_local;
  
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"2d",
             "2D Texture Filtering");
  node_00 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node_00,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"cube",
             "Cube Map Filtering");
  tcu::TestNode::addChild((TestNode *)this,node);
  tcu::TestNode::addChild((TestNode *)this,node_00);
  wrapMode = 0;
  uVar9 = extraout_RAX;
  while (wrapMode < 6) {
    for (format = 0; format < 2; format = format + 1) {
      for (size = 0; size < 3; size = size + 1) {
        for (_isMagNearest = 0; _isMagNearest < 2; _isMagNearest = _isMagNearest + 1) {
          for (iStack_64 = 0; iStack_64 < 2; iStack_64 = iStack_64 + 1) {
            bVar10 = false;
            if (init::minFilterModes[wrapMode].mode != 0x2600) {
              bVar10 = init::minFilterModes[wrapMode].mode != 0x2601;
            }
            dVar1 = init::wrapModes[size].mode;
            dVar2 = init::wrapModes[size].mode;
            dVar3 = init::magFilterModes[format].mode;
            dVar5 = deIsPowerOfTwo32(init::sizes2D[iStack_64].width);
            local_342 = false;
            if (dVar5 != 0) {
              dVar5 = deIsPowerOfTwo32(init::sizes2D[iStack_64].height);
              local_342 = dVar5 != 0;
            }
            name.field_2._M_local_buf[0xf] = local_342;
            if ((((!bVar10) && (dVar1 == 0x812f)) || (local_342 != false)) &&
               (((_isMagNearest == 0 || (!bVar10)) || ((dVar2 == 0x2901 && (dVar3 == 0x2600)))))) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"",&local_171)
              ;
              std::operator+(&local_150,&local_170,init::minFilterModes[wrapMode].name);
              std::operator+(&local_130,&local_150,"_");
              std::operator+(&local_110,&local_130,init::magFilterModes[format].name);
              std::operator+(&local_f0,&local_110,"_");
              std::operator+(&local_d0,&local_f0,init::wrapModes[size].name);
              std::operator+(&local_b0,&local_d0,"_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_90,&local_b0,init::formats[_isMagNearest].name);
              std::__cxx11::string::~string((string *)&local_b0);
              std::__cxx11::string::~string((string *)&local_d0);
              std::__cxx11::string::~string((string *)&local_f0);
              std::__cxx11::string::~string((string *)&local_110);
              std::__cxx11::string::~string((string *)&local_130);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_170);
              std::allocator<char>::~allocator(&local_171);
              if (!bVar10) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&minFilter_1,"_",(allocator<char> *)((long)&magFilter_1 + 3));
                std::operator+(&local_198,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &minFilter_1,init::sizes2D[iStack_64].name);
                std::__cxx11::string::operator+=((string *)local_90,(string *)&local_198);
                std::__cxx11::string::~string((string *)&local_198);
                std::__cxx11::string::~string((string *)&minFilter_1);
                std::allocator<char>::~allocator((allocator<char> *)((long)&magFilter_1 + 3));
              }
              this_00 = (Texture2DFilteringCase *)operator_new(0x128);
              pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              pRVar6 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
              pCVar7 = Context::getContextInfo((this->super_TestCaseGroup).m_context);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              Texture2DFilteringCase::Texture2DFilteringCase
                        (this_00,pTVar4,pRVar6,pCVar7,pcVar8,"",init::minFilterModes[wrapMode].mode,
                         init::magFilterModes[format].mode,init::wrapModes[size].mode,
                         init::wrapModes[size].mode,init::formats[_isMagNearest].format,
                         init::formats[_isMagNearest].dataType,init::sizes2D[iStack_64].width,
                         init::sizes2D[iStack_64].height);
              tcu::TestNode::addChild(node,(TestNode *)this_00);
              std::__cxx11::string::~string((string *)local_90);
            }
          }
        }
      }
    }
    wrapMode = wrapMode + 1;
    uVar9 = (ulong)(uint)wrapMode;
  }
  wrapMode_1 = 0;
  while (wrapMode_1 < 6) {
    for (format_1 = 0; format_1 < 2; format_1 = format_1 + 1) {
      for (size_1 = 0; size_1 < 3; size_1 = size_1 + 1) {
        for (_isMagNearest_1 = 0; _isMagNearest_1 < 2; _isMagNearest_1 = _isMagNearest_1 + 1) {
          for (iStack_1d0 = 0; iStack_1d0 < 2; iStack_1d0 = iStack_1d0 + 1) {
            local_389 = false;
            if (init::minFilterModes[wrapMode_1].mode != 0x2600) {
              local_389 = init::minFilterModes[wrapMode_1].mode != 0x2601;
            }
            name_1.field_2._M_local_buf[0xf] = local_389;
            name_1.field_2._M_local_buf[0xe] = init::wrapModes[size_1].mode == 0x812f;
            name_1.field_2._M_local_buf[0xd] = init::wrapModes[size_1].mode == 0x2901;
            name_1.field_2._M_local_buf[0xc] = init::magFilterModes[format_1].mode == 0x2600;
            dVar5 = deIsPowerOfTwo32(init::sizesCube[iStack_1d0].width);
            local_38a = false;
            if (dVar5 != 0) {
              dVar5 = deIsPowerOfTwo32(init::sizesCube[iStack_1d0].height);
              local_38a = dVar5 != 0;
            }
            name_1.field_2._M_local_buf[0xb] = local_38a;
            if (((((name_1.field_2._M_local_buf[0xf] & 1U) == 0) &&
                 ((name_1.field_2._M_local_buf[0xe] & 1U) != 0)) || (local_38a != false)) &&
               (((_isMagNearest_1 == 0 || ((name_1.field_2._M_local_buf[0xf] & 1U) == 0)) ||
                (((name_1.field_2._M_local_buf[0xd] & 1U) != 0 &&
                 ((name_1.field_2._M_local_buf[0xc] & 1U) != 0)))))) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"",&local_2d9)
              ;
              std::operator+(&local_2b8,&local_2d8,init::minFilterModes[wrapMode_1].name);
              std::operator+(&local_298,&local_2b8,"_");
              std::operator+(&local_278,&local_298,init::magFilterModes[format_1].name);
              std::operator+(&local_258,&local_278,"_");
              std::operator+(&local_238,&local_258,init::wrapModes[size_1].name);
              std::operator+(&local_218,&local_238,"_");
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1f8,&local_218,init::formats[_isMagNearest_1].name);
              std::__cxx11::string::~string((string *)&local_218);
              std::__cxx11::string::~string((string *)&local_238);
              std::__cxx11::string::~string((string *)&local_258);
              std::__cxx11::string::~string((string *)&local_278);
              std::__cxx11::string::~string((string *)&local_298);
              std::__cxx11::string::~string((string *)&local_2b8);
              std::__cxx11::string::~string((string *)&local_2d8);
              std::allocator<char>::~allocator(&local_2d9);
              if ((name_1.field_2._M_local_buf[0xf] & 1U) == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_320,"_",&local_321);
                std::operator+(&local_300,&local_320,init::sizesCube[iStack_1d0].name);
                std::__cxx11::string::operator+=((string *)local_1f8,(string *)&local_300);
                std::__cxx11::string::~string((string *)&local_300);
                std::__cxx11::string::~string((string *)&local_320);
                std::allocator<char>::~allocator(&local_321);
              }
              this_01 = (TextureCubeFilteringCase *)operator_new(0x128);
              pTVar4 = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              pRVar6 = Context::getRenderContext((this->super_TestCaseGroup).m_context);
              pCVar7 = Context::getContextInfo((this->super_TestCaseGroup).m_context);
              pcVar8 = (char *)std::__cxx11::string::c_str();
              TextureCubeFilteringCase::TextureCubeFilteringCase
                        (this_01,pTVar4,pRVar6,pCVar7,pcVar8,"",
                         init::minFilterModes[wrapMode_1].mode,init::magFilterModes[format_1].mode,
                         init::wrapModes[size_1].mode,init::wrapModes[size_1].mode,
                         init::formats[_isMagNearest_1].format,
                         init::formats[_isMagNearest_1].dataType,init::sizesCube[iStack_1d0].width,
                         init::sizesCube[iStack_1d0].height);
              tcu::TestNode::addChild(node_00,(TestNode *)this_01);
              std::__cxx11::string::~string((string *)local_1f8);
            }
          }
        }
      }
    }
    wrapMode_1 = wrapMode_1 + 1;
    uVar9 = (ulong)(uint)wrapMode_1;
  }
  return (int)uVar9;
}

Assistant:

void TextureFilteringTests::init (void)
{
	tcu::TestCaseGroup* group2D		= new tcu::TestCaseGroup(m_testCtx, "2d",	"2D Texture Filtering");
	tcu::TestCaseGroup*	groupCube	= new tcu::TestCaseGroup(m_testCtx, "cube",	"Cube Map Filtering");
	addChild(group2D);
	addChild(groupCube);

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} wrapModes[] =
	{
		{ "clamp",		GL_CLAMP_TO_EDGE },
		{ "repeat",		GL_REPEAT },
		{ "mirror",		GL_MIRRORED_REPEAT }
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} minFilterModes[] =
	{
		{ "nearest",				GL_NEAREST					},
		{ "linear",					GL_LINEAR					},
		{ "nearest_mipmap_nearest",	GL_NEAREST_MIPMAP_NEAREST	},
		{ "linear_mipmap_nearest",	GL_LINEAR_MIPMAP_NEAREST	},
		{ "nearest_mipmap_linear",	GL_NEAREST_MIPMAP_LINEAR	},
		{ "linear_mipmap_linear",	GL_LINEAR_MIPMAP_LINEAR		}
	};

	static const struct
	{
		const char*		name;
		deUint32		mode;
	} magFilterModes[] =
	{
		{ "nearest",	GL_NEAREST },
		{ "linear",		GL_LINEAR }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizes2D[] =
	{
		{ "pot",		32, 64 },
		{ "npot",		31, 55 }
	};

	static const struct
	{
		const char*		name;
		int				width;
		int				height;
	} sizesCube[] =
	{
		{ "pot",		64, 64 },
		{ "npot",		63, 63 }
	};

	static const struct
	{
		const char*		name;
		deUint32		format;
		deUint32		dataType;
	} formats[] =
	{
		{ "rgba8888",	GL_RGBA,			GL_UNSIGNED_BYTE			},
		{ "rgba4444",	GL_RGBA,			GL_UNSIGNED_SHORT_4_4_4_4	}
	};

#define FOR_EACH(ITERATOR, ARRAY, BODY)	\
	for (int (ITERATOR) = 0; (ITERATOR) < DE_LENGTH_OF_ARRAY(ARRAY); (ITERATOR)++)	\
		BODY

	// 2D cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizes2D,
		{
			bool isMipmap		= minFilterModes[minFilter].mode != GL_NEAREST && minFilterModes[minFilter].mode != GL_LINEAR;
			bool isClamp		= wrapModes[wrapMode].mode == GL_CLAMP_TO_EDGE;
			bool isRepeat		= wrapModes[wrapMode].mode == GL_REPEAT;
			bool isMagNearest	= magFilterModes[magFilter].mode == GL_NEAREST;
			bool isPotSize		= deIsPowerOfTwo32(sizes2D[size].width) && deIsPowerOfTwo32(sizes2D[size].height);

			if ((isMipmap || !isClamp) && !isPotSize)
				continue; // Not supported.

			if ((format != 0) && !(!isMipmap || (isRepeat && isMagNearest)))
				continue; // Skip.

			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name;

			if (!isMipmap)
				name += string("_") + sizes2D[size].name;

			group2D->addChild(new Texture2DFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
														 name.c_str(), "",
														 minFilterModes[minFilter].mode,
														 magFilterModes[magFilter].mode,
														 wrapModes[wrapMode].mode,
														 wrapModes[wrapMode].mode,
														 formats[format].format, formats[format].dataType,
														 sizes2D[size].width, sizes2D[size].height));
		})))));

	// Cubemap cases.
	FOR_EACH(minFilter,		minFilterModes,
	FOR_EACH(magFilter,		magFilterModes,
	FOR_EACH(wrapMode,		wrapModes,
	FOR_EACH(format,		formats,
	FOR_EACH(size,			sizesCube,
		{
			bool isMipmap		= minFilterModes[minFilter].mode != GL_NEAREST && minFilterModes[minFilter].mode != GL_LINEAR;
			bool isClamp		= wrapModes[wrapMode].mode == GL_CLAMP_TO_EDGE;
			bool isRepeat		= wrapModes[wrapMode].mode == GL_REPEAT;
			bool isMagNearest	= magFilterModes[magFilter].mode == GL_NEAREST;
			bool isPotSize		= deIsPowerOfTwo32(sizesCube[size].width) && deIsPowerOfTwo32(sizesCube[size].height);

			if ((isMipmap || !isClamp) && !isPotSize)
				continue; // Not supported.

			if (format != 0 && !(!isMipmap || (isRepeat && isMagNearest)))
				continue; // Skip.

			string name = string("") + minFilterModes[minFilter].name + "_" + magFilterModes[magFilter].name + "_" + wrapModes[wrapMode].name + "_" + formats[format].name;

			if (!isMipmap)
				name += string("_") + sizesCube[size].name;

			groupCube->addChild(new TextureCubeFilteringCase(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo(),
															 name.c_str(), "",
															 minFilterModes[minFilter].mode,
															 magFilterModes[magFilter].mode,
															 wrapModes[wrapMode].mode,
															 wrapModes[wrapMode].mode,
															 formats[format].format, formats[format].dataType,
															 sizesCube[size].width, sizesCube[size].height));
		})))));
}